

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSampleValue(AsciiParser *this,uint32_t type_id,Value *result)

{
  _Alloc_hider _Var1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 *puVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  size_type *psVar8;
  uint32_t tyid;
  uint32_t tyid_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint32_t extraout_EDX_09;
  uint32_t extraout_EDX_10;
  uint32_t extraout_EDX_11;
  uint32_t extraout_EDX_12;
  uint32_t extraout_EDX_13;
  uint32_t extraout_EDX_14;
  uint32_t extraout_EDX_15;
  uint32_t extraout_EDX_16;
  uint32_t extraout_EDX_17;
  uint32_t tyid_01;
  uint32_t tyid_02;
  uint32_t extraout_EDX_18;
  uint32_t extraout_EDX_19;
  uint32_t extraout_EDX_20;
  uint32_t extraout_EDX_21;
  uint32_t extraout_EDX_22;
  uint32_t extraout_EDX_23;
  uint32_t extraout_EDX_24;
  uint32_t extraout_EDX_25;
  uint32_t extraout_EDX_26;
  uint32_t extraout_EDX_27;
  uint32_t extraout_EDX_28;
  uint32_t extraout_EDX_29;
  uint32_t extraout_EDX_30;
  uint32_t extraout_EDX_31;
  uint32_t extraout_EDX_32;
  uint32_t extraout_EDX_33;
  uint32_t uVar9;
  uint32_t extraout_EDX_34;
  uint32_t extraout_EDX_35;
  size_type *psVar10;
  value *pvVar11;
  undefined8 uVar12;
  byte bVar13;
  texcoord3f typed_val_1;
  token typed_val;
  ostringstream ss_e;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [8];
  float afStack_260 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined1 local_248 [4];
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  float fStack_220;
  float fStack_21c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_218;
  double local_208;
  double dStack_200;
  double local_1f8;
  double local_1f0;
  double dStack_1e8;
  double local_1e0;
  double dStack_1d8;
  double local_1d0;
  storage_union local_1c0;
  undefined8 *local_1b0;
  half2 local_1a8;
  float fStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  vtable_type *local_198;
  ios_base local_138 [264];
  
  bVar13 = 0;
  if (result == (Value *)0x0) {
    return false;
  }
  bVar2 = MaybeNone(this);
  if (bVar2) {
    local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::ValueBlock>()::table;
    linb::any::swap((any *)&local_1a8,&result->v_);
    if (local_198 != (vtable_type *)0x0) {
      (*local_198->destroy)((storage_union *)&local_1a8);
    }
    return true;
  }
  local_1b0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_1c0.dynamic = (void *)0x0;
  switch(type_id) {
  case 6:
    _local_248 = (pointer)&local_238;
    fStack_240 = 0.0;
    fStack_23c = 0.0;
    local_238._M_allocated_capacity._0_4_ = local_238._M_allocated_capacity._0_4_ & 0xffffff00;
    bVar2 = ReadBasicType(this,(token *)local_248);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::Token>()::table;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)operator_new(0x20);
      paVar3->_M_allocated_capacity = (size_type)(paVar3->_M_local_buf + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)paVar3,_local_248,_local_248 + CONCAT44(fStack_23c,fStack_240));
      _local_1a8 = paVar3;
      linb::any::operator=((any *)&local_1c0,(any *)&local_1a8);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&local_1a8);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                 ,0x62);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x6d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      tinyusdz::value::GetTypeName_abi_cxx11_((string *)local_268,(value *)0x6,tyid_01);
      plVar6 = (long *)::std::__cxx11::string::replace((ulong)local_268,0,(char *)0x0,0x5eb5f8);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_288.field_2._M_allocated_capacity = *psVar8;
        local_288.field_2._8_8_ = plVar6[3];
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      }
      else {
        local_288.field_2._M_allocated_capacity = *psVar8;
        local_288._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_288._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_288);
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar3) {
        local_2a8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_2a8.field_2._8_8_ = plVar6[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_2a8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2a8._M_string_length = plVar6[1];
      *plVar6 = (long)paVar3;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,local_2a8._M_dataplus._M_p,
                          local_2a8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_268 != (undefined1  [8])&local_258) {
        operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      ::std::ios_base::~ios_base(local_138);
    }
    goto LAB_00431104;
  case 7:
    fStack_240 = 0.0;
    fStack_23c = 0.0;
    local_238._M_allocated_capacity._0_4_ = (uint)(uint3)local_238._M_allocated_capacity._1_3_ << 8;
    _local_248 = (pointer)&local_238;
    bVar2 = ReadBasicType(this,(string *)local_248);
    if (bVar2) {
      tinyusdz::value::Value::Value<std::__cxx11::string>
                ((Value *)&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248);
      linb::any::operator=((any *)&local_1c0,(any *)&local_1a8);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&local_1a8);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                 ,0x62);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x6e);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      tinyusdz::value::GetTypeName_abi_cxx11_((string *)local_268,(value *)0x7,tyid_02);
      ::std::operator+(&local_288,"Failed to parse value with requested type `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_268);
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_288);
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar3) {
        local_2a8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_2a8.field_2._8_8_ = plVar6[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_2a8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2a8._M_string_length = plVar6[1];
      *plVar6 = (long)paVar3;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,local_2a8._M_dataplus._M_p,
                          local_2a8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_268 != (undefined1  [8])&local_258) {
        operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      ::std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_248 != &local_238) goto LAB_0043110e;
    goto LAB_0043111b;
  default:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x95);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    tinyusdz::value::GetTypeName_abi_cxx11_(&local_2a8,(value *)(ulong)type_id,tyid);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                     " : TODO: timeSamples type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a8
                    );
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,(char *)CONCAT44(fStack_244,local_248),
                        CONCAT44(fStack_23c,fStack_240));
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(fStack_244,local_248) != &local_238) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(fStack_244,local_248),
                      CONCAT44(local_238._M_allocated_capacity._4_4_,
                               local_238._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_248);
    _Var1._M_p = _local_248;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_248 != &local_238) goto LAB_00430dfd;
    goto LAB_00430e0a;
  case 0xe:
    bVar2 = ReadBasicType(this,(half *)local_268);
    if (!bVar2) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                 ,0x62);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x77);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pvVar11 = (value *)0xe;
      uVar9 = extraout_EDX_12;
      break;
    }
    local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::half>()::table;
    local_1a8._M_elems[0].value = local_268._0_2_;
LAB_0042ef64:
    linb::any::operator=((any *)&local_1c0,(any *)&local_1a8);
    if (local_198 != (vtable_type *)0x0) {
      (*local_198->destroy)((storage_union *)&local_1a8);
    }
    goto LAB_0042ef88;
  case 0xf:
    bVar2 = ReadBasicType(this,(int *)local_268);
    if (bVar2) {
      puVar4 = linb::any::vtable_for_type<int>()::table;
LAB_0042ecdc:
      local_1a8._M_elems = (_Type)local_268._0_4_;
      local_198 = (vtable_type *)puVar4;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x70);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0xf;
    uVar9 = extraout_EDX_23;
    break;
  case 0x10:
    bVar2 = ReadBasicType(this,(int64_t *)local_268);
    if (bVar2) {
      _local_1a8 = local_268;
      local_198 = (vtable_type *)linb::any::vtable_for_type<long>()::table;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x75);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x10;
    uVar9 = extraout_EDX_24;
    break;
  case 0x11:
    bVar2 = ReadBasicType(this,(half2 *)local_268);
    if (bVar2) {
      puVar4 = (undefined1 *)
               &linb::any::vtable_for_type<std::array<tinyusdz::value::half,2ul>>()::table;
      goto LAB_0042ecdc;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x78);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x11;
    uVar9 = extraout_EDX_15;
    break;
  case 0x12:
    bVar2 = ReadBasicType(this,(half3 *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)
                  &linb::any::vtable_for_type<std::array<tinyusdz::value::half,3ul>>()::table;
      _local_1a8 = local_268._0_6_;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x79);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x12;
    uVar9 = extraout_EDX_18;
    break;
  case 0x13:
    bVar2 = ReadBasicType(this,(half4 *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)
                  &linb::any::vtable_for_type<std::array<tinyusdz::value::half,4ul>>()::table;
      _local_1a8 = local_268;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x7a);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x13;
    uVar9 = extraout_EDX_19;
    break;
  case 0x14:
    bVar2 = ReadBasicType(this,(int2 *)local_268);
    if (bVar2) {
      _local_1a8 = local_268;
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<int,2ul>>()::table;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x71);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x14;
    uVar9 = extraout_EDX_27;
    break;
  case 0x15:
    bVar2 = ReadBasicType(this,(int3 *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<int,3ul>>()::table;
LAB_0042ef17:
      _local_1a8 = local_268;
      uStack_1a0 = afStack_260[0];
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x72);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x15;
    uVar9 = extraout_EDX_26;
    break;
  case 0x16:
    bVar2 = ReadBasicType(this,(int4 *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<std::array<int,4ul>>()::table;
LAB_0042ef50:
LAB_0042ef61:
      fStack_1a4 = (float)local_268._4_4_;
      local_1a8._M_elems[0].value = (uint16_t)local_268._0_4_;
      local_1a8._M_elems[1].value = SUB42(local_268._0_4_,2);
      uStack_1a0 = afStack_260[0];
      uStack_19c = afStack_260[1];
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x73);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x16;
    uVar9 = extraout_EDX_06;
    break;
  case 0x1b:
    bVar2 = ReadBasicType(this,(uint32_t *)local_268);
    if (bVar2) {
      puVar4 = linb::any::vtable_for_type<unsigned_int>()::table;
      goto LAB_0042ecdc;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x74);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x1b;
    uVar9 = extraout_EDX_16;
    break;
  case 0x1c:
    bVar2 = ReadBasicType(this,(uint64_t *)local_268);
    if (bVar2) {
      _local_1a8 = local_268;
      local_198 = (vtable_type *)linb::any::vtable_for_type<unsigned_long>()::table;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x76);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x1c;
    uVar9 = extraout_EDX_10;
    break;
  case 0x28:
    bVar2 = ReadBasicType(this,(float *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<float>()::table;
      local_1a8._M_elems = (_Type)local_268._0_4_;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x6f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x28;
    uVar9 = extraout_EDX_03;
    break;
  case 0x29:
    bVar2 = ReadBasicType(this,(float2 *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<std::array<float,2ul>>()::table;
      _local_1a8 = local_268;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x7c);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x29;
    uVar9 = extraout_EDX_20;
    break;
  case 0x2a:
    bVar2 = ReadBasicType(this,(float3 *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<std::array<float,3ul>>()::table;
      goto LAB_0042ef17;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x7d);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x2a;
    uVar9 = extraout_EDX_21;
    break;
  case 0x2b:
    bVar2 = ReadBasicType(this,(float4 *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<std::array<float,4ul>>()::table;
      goto LAB_0042ef50;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x7e);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x2b;
    uVar9 = extraout_EDX_30;
    break;
  case 0x2c:
    bVar2 = ReadBasicType(this,(double *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<double>()::table;
      _local_1a8 = local_268;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x7f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x2c;
    uVar9 = extraout_EDX_28;
    break;
  case 0x2d:
    bVar2 = ReadBasicType(this,(double2 *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<std::array<double,2ul>>()::table;
      goto LAB_0042ef50;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x80);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x2d;
    uVar9 = extraout_EDX_01;
    break;
  case 0x2e:
    bVar2 = ReadBasicType(this,(double3 *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<std::array<double,3ul>>()::table;
LAB_0042eae7:
      _local_1a8 = operator_new(0x18);
      *(undefined1 (*) [8])_local_1a8 = local_268;
      *(float (*) [2])(_local_1a8 + 8) = afStack_260;
      *(size_type *)(_local_1a8 + 0x10) = local_258._M_allocated_capacity;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x81);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x2e;
    uVar9 = extraout_EDX_11;
    break;
  case 0x2f:
    bVar2 = ReadBasicType(this,(double4 *)local_248);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<std::array<double,4ul>>()::table;
LAB_0042ee4d:
      _local_1a8 = operator_new(0x20);
      *(size_type *)_local_1a8 = CONCAT44(fStack_244,local_248);
      *(ulong *)(_local_1a8 + 8) = CONCAT44(fStack_23c,fStack_240);
      *(ulong *)(_local_1a8 + 0x10) =
           CONCAT44(local_238._M_allocated_capacity._4_4_,local_238._M_allocated_capacity._0_4_);
      *(undefined8 *)(_local_1a8 + 0x18) = local_238._8_8_;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x82);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x2f;
    uVar9 = extraout_EDX_31;
    goto LAB_00430a8e;
  case 0x30:
    bVar2 = ReadBasicType(this,(quath *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::quath>()::table;
      _local_1a8 = local_268;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x83);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x30;
    uVar9 = extraout_EDX_02;
    break;
  case 0x31:
    bVar2 = ReadBasicType(this,(quatf *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::quatf>()::table;
      goto LAB_0042ef50;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x84);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x31;
    uVar9 = extraout_EDX_09;
    break;
  case 0x32:
    bVar2 = ReadBasicType(this,(quatd *)local_248);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::quatd>()::table;
      goto LAB_0042ee4d;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x85);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x32;
    uVar9 = extraout_EDX_05;
    goto LAB_00430a8e;
  case 0x33:
    local_268._0_2_ = 0;
    local_268._2_2_ = 0x3f80;
    local_268._4_2_ = 0;
    local_268._6_2_ = 0;
    afStack_260[0] = 0.0;
    afStack_260[1] = 1.0;
    bVar2 = ReadBasicType(this,(matrix2f *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::matrix2f>()::table;
      goto LAB_0042ef61;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x8f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x33;
    uVar9 = extraout_EDX_17;
    break;
  case 0x34:
    local_248 = (undefined1  [4])0x3f800000;
    fStack_244 = 0.0;
    fStack_240 = 0.0;
    fStack_23c = 0.0;
    local_238._M_allocated_capacity._0_4_ = 0x3f800000;
    local_238._M_allocated_capacity._4_4_ = 0;
    local_238._8_8_ = 0;
    local_228._M_p._0_4_ = 1.0;
    bVar2 = ReadBasicType(this,(matrix3f *)local_248);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::matrix3f>()::table;
      _local_1a8 = operator_new(0x24);
      *(size_type *)_local_1a8 = CONCAT44(fStack_244,local_248);
      *(ulong *)(_local_1a8 + 8) = CONCAT44(fStack_23c,fStack_240);
      *(ulong *)(_local_1a8 + 0x10) =
           CONCAT44(local_238._M_allocated_capacity._4_4_,local_238._M_allocated_capacity._0_4_);
      *(undefined8 *)(_local_1a8 + 0x18) = local_238._8_8_;
      *(float *)(_local_1a8 + 0x20) = local_228._M_p._0_4_;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x90);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x34;
    uVar9 = extraout_EDX_04;
    goto LAB_00430a8e;
  case 0x35:
    local_248 = (undefined1  [4])0x3f800000;
    fStack_244 = 0.0;
    fStack_240 = 0.0;
    fStack_23c = 0.0;
    local_238._M_allocated_capacity._0_4_ = 0;
    local_238._M_allocated_capacity._4_4_ = 0x3f800000;
    local_238._8_8_ = 0;
    local_228._M_p = (pointer)0x0;
    fStack_220 = 1.0;
    fStack_21c = 0.0;
    aStack_218._M_allocated_capacity._0_4_ = 0;
    aStack_218._M_allocated_capacity._4_4_ = 0;
    aStack_218._8_4_ = 0;
    aStack_218._12_4_ = 0x3f800000;
    bVar2 = ReadBasicType(this,(matrix4f *)local_248);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::matrix4f>()::table;
      _local_1a8 = operator_new(0x40);
      *(size_type *)_local_1a8 = CONCAT44(fStack_244,local_248);
      *(ulong *)(_local_1a8 + 8) = CONCAT44(fStack_23c,fStack_240);
      *(ulong *)(_local_1a8 + 0x10) =
           CONCAT44(local_238._M_allocated_capacity._4_4_,local_238._M_allocated_capacity._0_4_);
      *(undefined8 *)(_local_1a8 + 0x18) = local_238._8_8_;
      *(pointer *)(_local_1a8 + 0x20) = local_228._M_p;
      *(ulong *)(_local_1a8 + 0x28) = CONCAT44(fStack_21c,fStack_220);
      *(ulong *)(_local_1a8 + 0x30) =
           CONCAT44(aStack_218._M_allocated_capacity._4_4_,aStack_218._M_allocated_capacity._0_4_);
      *(ulong *)(_local_1a8 + 0x38) = CONCAT44(aStack_218._12_4_,aStack_218._8_4_);
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x91);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x35;
    uVar9 = extraout_EDX_33;
    goto LAB_00430a8e;
  case 0x36:
    local_248 = (undefined1  [4])0x0;
    fStack_244 = 1.875;
    fStack_240 = 0.0;
    fStack_23c = 0.0;
    local_238._M_allocated_capacity._0_4_ = 0;
    local_238._M_allocated_capacity._4_4_ = 0;
    local_238._8_8_ = 0x3ff0000000000000;
    bVar2 = ReadBasicType(this,(matrix2d *)local_248);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::matrix2d>()::table;
      goto LAB_0042ee4d;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x92);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x36;
    uVar9 = extraout_EDX_32;
    goto LAB_00430a8e;
  case 0x37:
    local_248 = (undefined1  [4])0x0;
    fStack_244 = 1.875;
    fStack_240 = 0.0;
    fStack_23c = 0.0;
    local_238._M_allocated_capacity._0_4_ = 0;
    local_238._M_allocated_capacity._4_4_ = 0;
    local_238._8_8_ = 0;
    local_228._M_p = (pointer)0x3ff0000000000000;
    fStack_220 = 0.0;
    fStack_21c = 0.0;
    aStack_218._M_allocated_capacity._0_4_ = 0;
    aStack_218._M_allocated_capacity._4_4_ = 0;
    aStack_218._8_4_ = 0;
    aStack_218._12_4_ = 0;
    local_208 = 1.0;
    bVar2 = ReadBasicType(this,(matrix3d *)local_248);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::matrix3d>()::table;
      _local_1a8 = operator_new(0x48);
      lVar7 = 9;
LAB_0042eac0:
      psVar10 = (size_type *)local_248;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_local_1a8;
      for (; lVar7 != 0; lVar7 = lVar7 + -1) {
        paVar3->_M_allocated_capacity = *psVar10;
        psVar10 = psVar10 + (ulong)bVar13 * -2 + 1;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar3->_M_local_buf + (ulong)bVar13 * -0x10 + 8);
      }
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x93);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x37;
    uVar9 = extraout_EDX_08;
    goto LAB_00430a8e;
  case 0x38:
    local_248 = (undefined1  [4])0x0;
    fStack_244 = 1.875;
    fStack_240 = 0.0;
    fStack_23c = 0.0;
    local_238._M_allocated_capacity._0_4_ = 0;
    local_238._M_allocated_capacity._4_4_ = 0;
    local_238._8_8_ = 0;
    local_228._M_p = (pointer)0x0;
    fStack_220 = 0.0;
    fStack_21c = 1.875;
    aStack_218._M_allocated_capacity._0_4_ = 0;
    aStack_218._M_allocated_capacity._4_4_ = 0;
    aStack_218._8_4_ = 0;
    aStack_218._12_4_ = 0;
    local_208 = 0.0;
    dStack_200 = 0.0;
    local_1f8 = 1.0;
    local_1f0 = 0.0;
    dStack_1e8 = 0.0;
    local_1e0 = 0.0;
    dStack_1d8 = 0.0;
    local_1d0 = 1.0;
    bVar2 = ReadBasicType(this,(matrix4d *)local_248);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::matrix4d>()::table;
      _local_1a8 = operator_new(0x80);
      lVar7 = 0x10;
      goto LAB_0042eac0;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x94);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x38;
    uVar9 = extraout_EDX_13;
    goto LAB_00430a8e;
  case 0x3a:
    bVar2 = ReadBasicType(this,(color3f *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::color3f>()::table;
      goto LAB_0042ef17;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x86);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x3a;
    uVar9 = extraout_EDX_22;
    break;
  case 0x3b:
    bVar2 = ReadBasicType(this,(color3d *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::color3d>()::table;
      goto LAB_0042eae7;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x88);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x3b;
    uVar9 = extraout_EDX_14;
    break;
  case 0x3d:
    bVar2 = ReadBasicType(this,(color4f *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::color4f>()::table;
      goto LAB_0042ef50;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x87);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x3d;
    uVar9 = extraout_EDX_35;
    break;
  case 0x3e:
    bVar2 = ReadBasicType(this,(color4d *)local_248);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::color4d>()::table;
      goto LAB_0042ee4d;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x89);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)&DAT_0000003e;
    uVar9 = extraout_EDX_07;
LAB_00430a8e:
    tinyusdz::value::GetTypeName_abi_cxx11_((string *)local_268,pvVar11,uVar9);
    ::std::operator+(&local_288,"Failed to parse value with requested type `",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268)
    ;
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_288);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar3) {
      local_2a8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_2a8.field_2._8_8_ = plVar6[3];
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    }
    else {
      local_2a8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_2a8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_2a8._M_string_length = plVar6[1];
    *plVar6 = (long)paVar3;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_268 != (undefined1  [8])&local_258) {
      operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_2a8);
    _Var1._M_p = (pointer)CONCAT44(fStack_244,local_248);
    uVar12 = local_2a8.field_2._M_allocated_capacity;
    _local_248 = local_2a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) goto LAB_00430e02;
    goto LAB_00430e0a;
  case 0x40:
    bVar2 = ReadBasicType(this,(point3f *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::point3f>()::table;
      goto LAB_0042ef17;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x8c);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)&DAT_00000040;
    uVar9 = extraout_EDX_29;
    break;
  case 0x43:
    bVar2 = ReadBasicType(this,(normal3f *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::normal3f>()::table;
      goto LAB_0042ef17;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x8b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x43;
    uVar9 = extraout_EDX_34;
    break;
  case 0x46:
    bVar2 = ReadBasicType(this,(vector3f *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::vector3f>()::table;
      goto LAB_0042ef17;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x8a);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x46;
    uVar9 = extraout_EDX_00;
    break;
  case 0x4a:
    bVar2 = ReadBasicType(this,(texcoord2f *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::texcoord2f>()::table;
      _local_1a8 = local_268;
      goto LAB_0042ef64;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x8d);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x4a;
    uVar9 = extraout_EDX_25;
    break;
  case 0x4d:
    bVar2 = ReadBasicType(this,(texcoord3f *)local_268);
    if (bVar2) {
      local_198 = (vtable_type *)&linb::any::vtable_for_type<tinyusdz::value::texcoord3f>()::table;
      goto LAB_0042ef17;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x8e);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pvVar11 = (value *)0x4d;
    uVar9 = extraout_EDX;
    break;
  case 0x51:
    _local_248 = (pointer)&local_238;
    fStack_240 = 0.0;
    fStack_23c = 0.0;
    local_238._M_allocated_capacity._0_4_ = (uint)(uint3)local_238._M_allocated_capacity._1_3_ << 8;
    local_228._M_p = (pointer)&aStack_218;
    fStack_220 = 0.0;
    fStack_21c = 0.0;
    aStack_218._M_allocated_capacity._0_4_ = aStack_218._M_allocated_capacity._0_4_ & 0xffffff00;
    bVar2 = ReadBasicType(this,(AssetPath *)local_248);
    if (bVar2) {
      local_198 = (vtable_type *)linb::any::vtable_for_type<tinyusdz::value::AssetPath>()::table;
      linb::any::do_construct<tinyusdz::value::AssetPath_const&,tinyusdz::value::AssetPath>
                ((any *)&local_1a8,(AssetPath *)local_248);
      linb::any::operator=((any *)&local_1c0,(any *)&local_1a8);
      if (local_198 != (vtable_type *)0x0) {
        (*local_198->destroy)((storage_union *)&local_1a8);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                 ,0x62);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"ParseTimeSampleValue",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1a8,0x6c);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      tinyusdz::value::GetTypeName_abi_cxx11_((string *)local_268,(value *)0x51,tyid_00);
      plVar6 = (long *)::std::__cxx11::string::replace((ulong)local_268,0,(char *)0x0,0x5eb5f8);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_288.field_2._M_allocated_capacity = *psVar8;
        local_288.field_2._8_8_ = plVar6[3];
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      }
      else {
        local_288.field_2._M_allocated_capacity = *psVar8;
        local_288._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_288._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)::std::__cxx11::string::append((char *)&local_288);
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar3) {
        local_2a8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_2a8.field_2._8_8_ = plVar6[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_2a8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_2a8._M_string_length = plVar6[1];
      *plVar6 = (long)paVar3;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,local_2a8._M_dataplus._M_p,
                          local_2a8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_268 != (undefined1  [8])&local_258) {
        operator_delete((void *)local_268,local_258._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      ::std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_p != &aStack_218) {
      operator_delete(local_228._M_p,
                      CONCAT44(aStack_218._M_allocated_capacity._4_4_,
                               aStack_218._M_allocated_capacity._0_4_) + 1);
    }
LAB_00431104:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_248 != &local_238) {
LAB_0043110e:
      operator_delete(_local_248,
                      CONCAT44(local_238._M_allocated_capacity._4_4_,
                               local_238._M_allocated_capacity._0_4_) + 1);
    }
LAB_0043111b:
    if (bVar2 != false) {
LAB_0042ef88:
      linb::any::operator=(&result->v_,(any *)&local_1c0);
      bVar2 = true;
      goto LAB_00430e2d;
    }
    goto LAB_00430e2b;
  }
  tinyusdz::value::GetTypeName_abi_cxx11_((string *)&local_288,pvVar11,uVar9);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a8,
                   "Failed to parse value with requested type `",&local_288);
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_2a8);
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar3) {
    local_238._8_8_ = plVar6[3];
    local_238._M_allocated_capacity._0_4_ = (undefined4)paVar3->_M_allocated_capacity;
    local_238._M_allocated_capacity._4_4_ = (undefined4)(paVar3->_M_allocated_capacity >> 0x20);
    _local_248 = (pointer)&local_238;
  }
  else {
    local_238._M_allocated_capacity._0_4_ = (undefined4)paVar3->_M_allocated_capacity;
    local_238._M_allocated_capacity._4_4_ = (undefined4)(paVar3->_M_allocated_capacity >> 0x20);
    _local_248 = (pointer)*plVar6;
  }
  lVar7 = plVar6[1];
  fStack_240 = (float)lVar7;
  fStack_23c = (float)((ulong)lVar7 >> 0x20);
  *plVar6 = (long)paVar3;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a8,_local_248,lVar7);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_248 != &local_238) {
    operator_delete(_local_248,
                    CONCAT44(local_238._M_allocated_capacity._4_4_,
                             local_238._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  PushError(this,(string *)local_248);
  _Var1._M_p = _local_248;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_local_248 != &local_238) {
LAB_00430dfd:
    uVar12 = CONCAT44(local_238._M_allocated_capacity._4_4_,local_238._M_allocated_capacity._0_4_);
    _Var1._M_p = _local_248;
LAB_00430e02:
    operator_delete(_local_248,uVar12 + 1);
    _local_248 = _Var1._M_p;
    _Var1._M_p = _local_248;
  }
LAB_00430e0a:
  _local_248 = _Var1._M_p;
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  ::std::ios_base::~ios_base(local_138);
LAB_00430e2b:
  bVar2 = false;
LAB_00430e2d:
  if (local_1b0 != (undefined8 *)0x0) {
    (*(code *)local_1b0[4])(&local_1c0);
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ParseTimeSampleValue(const uint32_t type_id, value::Value *result) {

  if (!result) {
    return false;
  }

  if (MaybeNone()) {
    (*result) = value::ValueBlock();
    return true;
  }

  value::Value val;

#define PARSE_TYPE(__tyid, __type)                       \
  if (__tyid == value::TypeTraits<__type>::type_id()) {             \
    __type typed_val; \
    if (!ReadBasicType(&typed_val)) {                             \
      PUSH_ERROR_AND_RETURN("Failed to parse value with requested type `" + value::GetTypeName(__tyid) + "`"); \
    }                                                                  \
    val = value::Value(typed_val); \
  } else

  // NOTE: `string` does not support multi-line string.
  PARSE_TYPE(type_id, value::AssetPath)
  PARSE_TYPE(type_id, value::token)
  PARSE_TYPE(type_id, std::string)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, int32_t)
  PARSE_TYPE(type_id, value::int2)
  PARSE_TYPE(type_id, value::int3)
  PARSE_TYPE(type_id, value::int4)
  PARSE_TYPE(type_id, uint32_t)
  PARSE_TYPE(type_id, int64_t)
  PARSE_TYPE(type_id, uint64_t)
  PARSE_TYPE(type_id, value::half)
  PARSE_TYPE(type_id, value::half2)
  PARSE_TYPE(type_id, value::half3)
  PARSE_TYPE(type_id, value::half4)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, value::float2)
  PARSE_TYPE(type_id, value::float3)
  PARSE_TYPE(type_id, value::float4)
  PARSE_TYPE(type_id, double)
  PARSE_TYPE(type_id, value::double2)
  PARSE_TYPE(type_id, value::double3)
  PARSE_TYPE(type_id, value::double4)
  PARSE_TYPE(type_id, value::quath)
  PARSE_TYPE(type_id, value::quatf)
  PARSE_TYPE(type_id, value::quatd)
  PARSE_TYPE(type_id, value::color3f)
  PARSE_TYPE(type_id, value::color4f)
  PARSE_TYPE(type_id, value::color3d)
  PARSE_TYPE(type_id, value::color4d)
  PARSE_TYPE(type_id, value::vector3f)
  PARSE_TYPE(type_id, value::normal3f)
  PARSE_TYPE(type_id, value::point3f)
  PARSE_TYPE(type_id, value::texcoord2f)
  PARSE_TYPE(type_id, value::texcoord3f)
  PARSE_TYPE(type_id, value::matrix2f)
  PARSE_TYPE(type_id, value::matrix3f)
  PARSE_TYPE(type_id, value::matrix4f)
  PARSE_TYPE(type_id, value::matrix2d)
  PARSE_TYPE(type_id, value::matrix3d)
  PARSE_TYPE(type_id, value::matrix4d) {
    PUSH_ERROR_AND_RETURN(" : TODO: timeSamples type " + value::GetTypeName(type_id));
  }

#undef PARSE_TYPE

  (*result) = val;

  return true;
}